

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall gl4cts::EnhancedLayouts::XFBInputTest::testInit(XFBInputTest *this)

{
  value_type local_20;
  testCase test_case;
  GLuint stage;
  GLuint qualifier;
  XFBInputTest *this_local;
  
  for (test_case.m_stage = COMPUTE; test_case.m_stage < TESS_EVAL;
      test_case.m_stage = test_case.m_stage + VERTEX) {
    for (test_case.m_qualifier = BUFFER; test_case.m_qualifier < 6;
        test_case.m_qualifier = test_case.m_qualifier + STRIDE) {
      if (test_case.m_qualifier != BUFFER) {
        local_20.m_qualifier = test_case.m_stage;
        local_20.m_stage = test_case.m_qualifier;
        std::
        vector<gl4cts::EnhancedLayouts::XFBInputTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBInputTest::testCase>_>
        ::push_back(&this->m_test_cases,&local_20);
      }
    }
  }
  return;
}

Assistant:

void XFBInputTest::testInit()
{
	for (GLuint qualifier = 0; qualifier < QUALIFIERS_MAX; ++qualifier)
	{
		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			if (Utils::Shader::COMPUTE == stage)
			{
				continue;
			}

			testCase test_case = { (QUALIFIERS)qualifier, (Utils::Shader::STAGES)stage };

			m_test_cases.push_back(test_case);
		}
	}
}